

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwindowsysteminterface.cpp
# Opt level: O3

bool QWindowSystemHelper<QWindowSystemInterface::SynchronousDelivery>::
     handleEvent<QWindowSystemInterfacePrivate::FocusWindowEvent,QWindow*,Qt::FocusReason>
               (QWindow *args,FocusReason args_1)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  undefined1 uVar4;
  int *piVar5;
  long in_FS_OFFSET;
  WindowSystemEvent local_50;
  int *piStack_38;
  QWindow *local_30;
  FocusReason FStack_28;
  undefined4 uStack_24;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  cVar1 = QThread::isMainThread();
  if (cVar1 == '\0') {
    QWindowSystemHelper<QWindowSystemInterface::AsynchronousDelivery>::
    handleEvent<QWindowSystemInterfacePrivate::FocusWindowEvent,QWindow*,Qt::FocusReason>
              (args,args_1);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      bVar2 = QWindowSystemInterface::flushWindowSystemEvents((ProcessEventsFlags)0x0);
      return bVar2;
    }
    goto LAB_0032c26e;
  }
  local_50._20_4_ = 0xaaaaaaaa;
  piStack_38 = (int *)&DAT_aaaaaaaaaaaaaaaa;
  local_30 = (QWindow *)&DAT_aaaaaaaaaaaaaaaa;
  FStack_28 = 0xaaaaaaaa;
  uStack_24 = 0xaaaaaaaa;
  local_50.type = FocusWindow;
  local_50.flags = 0;
  local_50.eventAccepted = true;
  local_50._17_3_ = 0xaaaaaa;
  local_50._vptr_WindowSystemEvent = (_func_int **)&PTR__FocusWindowEvent_007d8648;
  if (args == (QWindow *)0x0) {
    piStack_38 = (int *)0x0;
  }
  else {
    piStack_38 = (int *)QtSharedPointer::ExternalRefCountData::getAndRef(&args->super_QObject);
  }
  local_30 = args;
  FStack_28 = args_1;
  if (QWindowSystemInterfacePrivate::eventHandler == (QWindowSystemEventHandler *)0x0) {
    QGuiApplicationPrivate::processWindowSystemEvent(&local_50);
LAB_0032c229:
    uVar4 = local_50.eventAccepted;
  }
  else {
    iVar3 = (*QWindowSystemInterfacePrivate::eventHandler->_vptr_QWindowSystemEventHandler[2])
                      (QWindowSystemInterfacePrivate::eventHandler,&local_50);
    if ((char)iVar3 != '\0') goto LAB_0032c229;
    uVar4 = 0;
  }
  local_50._vptr_WindowSystemEvent = (_func_int **)&PTR__FocusWindowEvent_007d8648;
  if (piStack_38 != (int *)0x0) {
    LOCK();
    *piStack_38 = *piStack_38 + -1;
    UNLOCK();
    if (*piStack_38 == 0) {
      piVar5 = piStack_38;
      if (piStack_38 == (int *)0x0) {
        piVar5 = (int *)0x0;
      }
      operator_delete(piVar5);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (bool)uVar4;
  }
LAB_0032c26e:
  __stack_chk_fail();
}

Assistant:

bool QWindowSystemHelper<QWindowSystemInterface::SynchronousDelivery>::handleEvent(Args ...args)
{
    if (QThread::isMainThread()) {
        EventType event(args...);
        // Process the event immediately on the Gui thread and return the accepted state
        if (QWindowSystemInterfacePrivate::eventHandler) {
            if (!QWindowSystemInterfacePrivate::eventHandler->sendEvent(&event))
                return false;
        } else {
            QGuiApplicationPrivate::processWindowSystemEvent(&event);
        }
        return event.eventAccepted;
    } else {
        // Post the event on the Qt main thread queue and flush the queue.
        // This will wake up the Gui thread which will process the event.
        // Return the accepted state for the last event on the queue,
        // which is the event posted by this function.
        QWindowSystemHelper<QWindowSystemInterface::AsynchronousDelivery>::handleEvent<EventType>(args...);
        return QWindowSystemInterface::flushWindowSystemEvents();
    }
}